

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool __thiscall
cmQtAutoGenerator::InfoT::GetArray
          (InfoT *this,string *key,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,bool required)

{
  bool bVar1;
  Value *this_00;
  string_view message;
  string local_a8;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  this_00 = Json::Value::operator[](&this->Json_,key);
  bVar1 = Json::Value::isArray(this_00);
  if ((!bVar1) && (bVar1 = Json::Value::isNull(this_00), !bVar1 || required)) {
    local_58.View_._M_str = (key->_M_dataplus)._M_p;
    local_58.View_._M_len = key->_M_string_length;
    local_88.View_._M_len = 0x11;
    local_88.View_._M_str = " is not an array.";
    cmStrCat<>(&local_a8,&local_58,&local_88);
    message._M_str = local_a8._M_dataplus._M_p;
    message._M_len = local_a8._M_string_length;
    LogError(this,message);
    std::__cxx11::string::~string((string *)&local_a8);
    return false;
  }
  bVar1 = GetJsonArray(list,this_00);
  return !required || bVar1;
}

Assistant:

bool cmQtAutoGenerator::InfoT::GetArray(std::string const& key,
                                        std::unordered_set<std::string>& list,
                                        bool required) const
{
  Json::Value const& jval = this->Json_[key];
  if (!jval.isArray()) {
    if (!jval.isNull() || required) {
      return this->LogError(cmStrCat(key, " is not an array."));
    }
  }
  return GetJsonArray(list, jval) || !required;
}